

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  int a;
  int e;
  expdesc *ex_local;
  expdesc *var_local;
  FuncState *fs_local;
  
  switch(var->k) {
  case VLOCAL:
    freeexp(fs,ex);
    exp2reg(fs,ex,(uint)(var->u).var.ridx);
    return;
  case VUPVAL:
    a = luaK_exp2anyreg(fs,ex);
    luaK_codeABCk(fs,OP_SETUPVAL,a,(var->u).info,0,0);
    break;
  default:
    break;
  case VINDEXED:
    codeABRK(fs,OP_SETTABLE,(uint)(var->u).ind.t,(int)(var->u).ind.idx,ex);
    break;
  case VINDEXUP:
    codeABRK(fs,OP_SETTABUP,(uint)(var->u).ind.t,(int)(var->u).ind.idx,ex);
    break;
  case VINDEXI:
    codeABRK(fs,OP_SETI,(uint)(var->u).ind.t,(int)(var->u).ind.idx,ex);
    break;
  case VINDEXSTR:
    codeABRK(fs,OP_SETFIELD,(uint)(var->u).ind.t,(int)(var->u).ind.idx,ex);
  }
  freeexp(fs,ex);
  return;
}

Assistant:

void luaK_storevar (FuncState *fs, expdesc *var, expdesc *ex) {
  switch (var->k) {
    case VLOCAL: {
      freeexp(fs, ex);
      exp2reg(fs, ex, var->u.var.ridx);  /* compute 'ex' into proper place */
      return;
    }
    case VUPVAL: {
      int e = luaK_exp2anyreg(fs, ex);
      luaK_codeABC(fs, OP_SETUPVAL, e, var->u.info, 0);
      break;
    }
    case VINDEXUP: {
      codeABRK(fs, OP_SETTABUP, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    case VINDEXI: {
      codeABRK(fs, OP_SETI, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    case VINDEXSTR: {
      codeABRK(fs, OP_SETFIELD, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    case VINDEXED: {
      codeABRK(fs, OP_SETTABLE, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    default: lua_assert(0);  /* invalid var kind to store */
  }
  freeexp(fs, ex);
}